

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O3

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::PartialPivLU
          (PartialPivLU<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *this,MatrixType *matrix)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.m_rows;
  (this->m_lu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.m_rows = 0;
  (this->m_lu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.m_cols = 0;
  if (4 < uVar1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1, 0, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1, 0, 4, 4>]"
                 );
  }
  (this->m_lu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.m_rows =
       uVar1;
  (this->m_lu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.m_cols =
       uVar1;
  iVar2 = (int)(matrix->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.
               m_rows;
  (this->m_p).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,_4,_1>_>.m_storage.m_rows
       = (long)iVar2;
  if (-1 < iVar2) {
    (this->m_rowsTranspositions).m_indices.
    super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,_4,_1>_>.m_storage.m_rows = (long)iVar2;
    this->m_det_p = 0;
    this->m_isInitialized = false;
    compute(this,matrix);
    return;
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/Matrix.h"
                ,0xf0,
                "Eigen::Matrix<int, -1, 1, 0, 4, 1>::Matrix(Index) [_Scalar = int, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = 4, _MaxCols = 1]"
               );
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const MatrixType& matrix)
  : m_lu(matrix.rows(), matrix.rows()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix);
}